

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t * Acb_NtkFindDivs(Acb_Ntk_t *p,Vec_Int_t *vSupp,Vec_Bit_t *vBlock,int fVerbose)

{
  int iVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  int *pArray;
  Vec_Int_t *vDivs;
  int local_30;
  int iObj;
  int i;
  int nDivLimit;
  int fPrintWeights;
  int fVerbose_local;
  Vec_Bit_t *vBlock_local;
  Vec_Int_t *vSupp_local;
  Acb_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  Acb_NtkIncTravId(p);
  for (local_30 = 0; iVar1 = Vec_IntSize(vSupp), local_30 < iVar1; local_30 = local_30 + 1) {
    iVar1 = Vec_IntEntry(vSupp,local_30);
    iVar1 = Acb_NtkCi(p,iVar1);
    Acb_ObjSetTravIdCur(p,iVar1);
    iVar2 = Acb_ObjWeight(p,iVar1);
    if (0 < iVar2) {
      Vec_IntPush(p_00,iVar1);
    }
  }
  Acb_NtkIncTravId(p);
  for (vDivs._4_4_ = 1; iVar1 = Vec_StrSize(&p->vObjType), vDivs._4_4_ < iVar1;
      vDivs._4_4_ = vDivs._4_4_ + 1) {
    AVar3 = Acb_ObjType(p,vDivs._4_4_);
    if ((((AVar3 != ABC_OPER_NONE) && (iVar1 = Acb_ObjIsCio(p,vDivs._4_4_), iVar1 == 0)) &&
        (iVar1 = Vec_BitEntry(vBlock,vDivs._4_4_), iVar1 == 0)) &&
       ((iVar1 = Acb_ObjWeight(p,vDivs._4_4_), 0 < iVar1 &&
        (iVar1 = Acb_NtkFindDivs_rec(p,vDivs._4_4_), iVar1 != 0)))) {
      Vec_IntPush(p_00,vDivs._4_4_);
    }
  }
  pArray = Vec_IntArray(p_00);
  iVar1 = Vec_IntSize(p_00);
  Vec_IntSelectSortCost(pArray,iVar1,&p->vObjWeight);
  iVar1 = Vec_IntSize(p_00);
  iVar1 = Abc_MinInt(iVar1,3000);
  if (fVerbose != 0) {
    uVar4 = Vec_IntSize(p_00);
    printf("Reducing divisor set from %d to ",(ulong)uVar4);
  }
  Vec_IntShrink(p_00,iVar1);
  if (fVerbose != 0) {
    uVar4 = Vec_IntSize(p_00);
    printf("%d.\n",(ulong)uVar4);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindDivs( Acb_Ntk_t * p, Vec_Int_t * vSupp, Vec_Bit_t * vBlock, int fVerbose )
{
    int fPrintWeights = 0;
    int nDivLimit = 3000;
    int i, iObj;
    Vec_Int_t * vDivs = Vec_IntAlloc( 1000 );
    // mark inputs
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCiVec( vSupp, p, iObj, i )
    {
        Acb_ObjSetTravIdCur( p, iObj );
        if ( Acb_ObjWeight(p, iObj) > 0 )
            Vec_IntPush( vDivs, iObj );
    }
    // collect nodes whose support is contained in vSupp
    Acb_NtkIncTravId( p );
    Acb_NtkForEachNode( p, iObj )
        if ( !Vec_BitEntry(vBlock, iObj) && Acb_ObjWeight(p, iObj) > 0 && Acb_NtkFindDivs_rec(p, iObj) )
            Vec_IntPush( vDivs, iObj );
    // sort divisors by cost (first cheap ones; later expensive ones)
    Vec_IntSelectSortCost( Vec_IntArray(vDivs), Vec_IntSize(vDivs), &p->vObjWeight );
    //Vec_IntPrint( vDivs );
    nDivLimit = Abc_MinInt( Vec_IntSize(vDivs), nDivLimit );
    if ( fPrintWeights )
    {
//        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
//            printf( "%d:%d (w=%d)   ", i, iObj, Vec_IntEntry(&p->vObjWeight, iObj) );
//        printf( "\n" );

        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 100) % 10 );
        printf( "\n" );
        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 10) % 10 );
        printf( "\n" );
        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 1) % 10 );
        printf( "\n" );
    }
    if ( fVerbose )
    printf( "Reducing divisor set from %d to ", Vec_IntSize(vDivs) );
    Vec_IntShrink( vDivs, nDivLimit );
    if ( fVerbose )
    printf( "%d.\n", Vec_IntSize(vDivs) );
    return vDivs;
}